

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_codim_mesh_data_set.h
# Opt level: O0

void __thiscall
lf::mesh::utils::
AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
::AllCodimMeshDataSet
          (AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
           *this,shared_ptr<const_lf::mesh::Mesh> *mesh)

{
  dim_t dVar1;
  uint uVar2;
  element_type *peVar3;
  reference this_00;
  uint local_28;
  dim_t codim;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  *this_local;
  
  (this->
  super_MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  )._vptr_MeshDataSet = (_func_int **)0x0;
  MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  ::MeshDataSet(&this->
                 super_MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
               );
  (this->
  super_MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  )._vptr_MeshDataSet = (_func_int **)&PTR_operator___00ab6768;
  peVar3 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  dVar1 = (**peVar3->_vptr_Mesh)();
  this->dim_mesh_ = dVar1;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&this->mesh_,mesh);
  boost::container::
  vector<boost::container::vector<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>,_void,_void>,_void,_void>
  ::vector(&this->data_,(ulong)(this->dim_mesh_ + 1));
  for (local_28 = 0; local_28 <= this->dim_mesh_; local_28 = local_28 + 1) {
    this_00 = boost::container::
              vector<boost::container::vector<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>,_void,_void>,_void,_void>
              ::operator[](&this->data_,(ulong)local_28);
    peVar3 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_);
    uVar2 = (*peVar3->_vptr_Mesh[3])(peVar3,(ulong)local_28);
    boost::container::
    vector<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>,_void,_void>
    ::resize(this_00,(ulong)uVar2);
  }
  return;
}

Assistant:

explicit AllCodimMeshDataSet(
      const std::shared_ptr<const lf::mesh::Mesh>& mesh)
      : MeshDataSet<T>(),
        dim_mesh_(mesh->DimMesh()),
        mesh_(mesh),
        data_(dim_mesh_ + 1) {
    for (dim_t codim = 0; codim <= dim_mesh_; ++codim) {
      data_[codim].resize(mesh_->NumEntities(codim));
    }
  }